

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O1

void __thiscall amrex::TagBox::tags(TagBox *this,Vector<int,_std::allocator<int>_> *ar)

{
  pointer piVar1;
  pointer piVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  piVar1 = (ar->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  piVar2 = (ar->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish;
  if (piVar2 != piVar1 && -1 < (long)piVar2 - (long)piVar1) {
    lVar4 = 0;
    do {
      if (piVar1[lVar4] != 0) {
        pcVar3[lVar4] = (char)piVar1[lVar4];
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < (long)(ar->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(ar->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start >> 2);
  }
  return;
}

Assistant:

void
TagBox::tags (const Vector<int>& ar) noexcept
{
    BL_ASSERT(ar.size() == domain.numPts());

    TagType*   cptr = dataPtr();
    const int* iptr = ar.dataPtr();

    for (int i = 0; i < ar.size(); i++, cptr++, iptr++)
    {
        if (*iptr)
            *cptr = *iptr;
    }
}